

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin.h
# Opt level: O0

void __thiscall beagle::plugin::Plugin::~Plugin(Plugin *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR_pluginName_abi_cxx11__0013cc88;
  std::__cxx11::string::~string((string *)(in_RDI + 0xb));
  std::__cxx11::string::~string((string *)(in_RDI + 7));
  std::__cxx11::list<BeagleResource,_std::allocator<BeagleResource>_>::~list
            ((list<BeagleResource,_std::allocator<BeagleResource>_> *)0x133516);
  std::__cxx11::list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_>::
  ~list((list<beagle::BeagleImplFactory_*,_std::allocator<beagle::BeagleImplFactory_*>_> *)0x133524)
  ;
  return;
}

Assistant:

class BEAGLE_DLLEXPORT Plugin
{
  public:
	Plugin() {}

    Plugin(const char* plugin_name, const char* plugin_type)
    : m_plugin_name(plugin_name), m_plugin_type(plugin_type) {}

    virtual std::string pluginName() const{ return m_plugin_name; }
    virtual std::string pluginType() const{ return m_plugin_type; }

    virtual const std::list<beagle::BeagleImplFactory*>& getBeagleFactories() const{ return beagleFactories; }
    virtual const std::list<BeagleResource>& getBeagleResources() const{ return beagleResources; }

protected:
    std::list<beagle::BeagleImplFactory*> beagleFactories;
    std::list<BeagleResource> beagleResources;
    std::string m_plugin_name;
    std::string m_plugin_type;
}